

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double regularizer_direction_magnitude<dense_parameters>
                 (vw *param_1,bfgs *b,double regularizer,dense_parameters *weights)

{
  weight *pwVar1;
  uint64_t uVar2;
  byte bVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pwVar1 = weights->_begin;
  uVar2 = weights->_weight_mask;
  if (b->regularizers == (weight *)0x0) {
    if (pwVar1 == pwVar1 + uVar2 + 1) {
      return 0.0;
    }
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      dVar6 = (double)*(float *)((long)pwVar1 + lVar4 + 8);
      dVar5 = dVar5 + dVar6 * regularizer * dVar6;
      lVar4 = lVar4 + (1L << ((byte)weights->_stride_shift & 0x3f)) * 4;
    } while (uVar2 * 4 + 4 != lVar4);
  }
  else {
    if (pwVar1 == pwVar1 + uVar2 + 1) {
      return 0.0;
    }
    bVar3 = (byte)weights->_stride_shift;
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      dVar6 = (double)*(float *)((long)pwVar1 + lVar4 + 8);
      dVar5 = dVar5 + (double)b->regularizers[((ulong)(lVar4 >> 2) >> (bVar3 & 0x3f)) * 2] * dVar6 *
                      dVar6;
      lVar4 = lVar4 + (1L << (bVar3 & 0x3f)) * 4;
    } while (uVar2 * 4 + 4 != lVar4);
  }
  return dVar5;
}

Assistant:

double regularizer_direction_magnitude(vw& /* all */, bfgs& b, double regularizer, T& weights)
{
  double ret = 0.;
  if (b.regularizers == nullptr)
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += regularizer * (&(*iter))[W_DIR] * (&(*iter))[W_DIR];

  else
  {
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += ((double)b.regularizers[2 * (iter.index() >> weights.stride_shift())]) * (&(*iter))[W_DIR] *
          (&(*iter))[W_DIR];
  }
  return ret;
}